

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateVkImpl::InitPipelineLayout
          (PipelineStateVkImpl *this,PipelineStateCreateInfo *CreateInfo,TShaderStages *ShaderStages
          )

{
  bool bVar1;
  PSO_CREATE_INTERNAL_FLAGS PVar2;
  PSO_CREATE_FLAGS PVar3;
  Uint32 UVar4;
  PipelineResourceSignatureDesc *SignDesc_00;
  RenderDeviceVkImpl *pDeviceVk;
  Char *pCVar5;
  reference pvVar6;
  char (*Args_1) [16];
  bool local_1ad;
  uint local_18c;
  undefined1 local_188 [4];
  Uint32 i;
  TBindIndexToDescSetIndex BindIndexToDescSetIndex;
  string msg_1;
  undefined1 local_140 [6];
  bool VerifyBindings;
  bool RemapResources;
  string msg;
  SHADER_TYPE local_118 [4];
  undefined1 local_108 [8];
  PipelineResourceSignatureDescWrapper SignDesc;
  PSO_CREATE_INTERNAL_FLAGS InternalFlags;
  TShaderStages *ShaderStages_local;
  PipelineStateCreateInfo *CreateInfo_local;
  PipelineStateVkImpl *this_local;
  
  SignDesc.m_Desc._52_4_ =
       PipelineStateBase<Diligent::EngineVkImplTraits>::GetInternalCreateFlags(CreateInfo);
  if ((((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_UsingImplicitSignature & 1U)
       != 0) &&
     (PVar2 = Diligent::operator&(SignDesc.m_Desc._52_4_,
                                  PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0),
     PVar2 == PSO_CREATE_INTERNAL_FLAG_NONE)) {
    GetDefaultResourceSignatureDesc
              ((PipelineResourceSignatureDescWrapper *)local_108,ShaderStages,
               (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc.ResourceLayout,
               (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
               .m_Desc.SRBAllocationGranularity);
    SignDesc_00 = PipelineResourceSignatureDescWrapper::
                  operator_cast_to_PipelineResourceSignatureDesc_
                            ((PipelineResourceSignatureDescWrapper *)local_108);
    local_118[0] = PipelineStateBase<Diligent::EngineVkImplTraits>::GetActiveShaderStages
                             (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    msg.field_2._M_local_buf[0xf] = '\0';
    Args_1 = (char (*) [16])((long)&msg.field_2 + 0xf);
    PipelineStateBase<Diligent::EngineVkImplTraits>::
    InitDefaultSignature<Diligent::SHADER_TYPE,bool>
              (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>,SignDesc_00,local_118,
               (bool *)Args_1);
    bVar1 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator!
                      ((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_Signatures);
    if (bVar1) {
      FormatString<char[26],char[16]>
                ((string *)local_140,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_Signatures[0]",Args_1);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"InitPipelineLayout",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x31a);
      std::__cxx11::string::~string((string *)local_140);
    }
    PipelineResourceSignatureDescWrapper::~PipelineResourceSignatureDescWrapper
              ((PipelineResourceSignatureDescWrapper *)local_108);
  }
  DvpValidateResourceLimits(this);
  pDeviceVk = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
              ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                           *)this);
  PipelineLayoutVk::Create
            (&this->m_PipelineLayout,pDeviceVk,
             (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_Signatures,
             (uint)(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount);
  PVar3 = Diligent::operator&(CreateInfo->Flags,PSO_CREATE_FLAG_DONT_REMAP_SHADER_RESOURCES);
  local_1ad = false;
  if (PVar3 != PSO_CREATE_FLAG_NONE) {
    PVar2 = Diligent::operator&(SignDesc.m_Desc._52_4_,PSO_CREATE_INTERNAL_FLAG_LAST);
    local_1ad = PVar2 == PSO_CREATE_INTERNAL_FLAG_NONE;
    if (!local_1ad) {
      return;
    }
  }
  if ((PVar3 == PSO_CREATE_FLAG_NONE) == local_1ad) {
    FormatString<char[26],char[32]>
              ((string *)(BindIndexToDescSetIndex._M_elems + 6),
               (Diligent *)"Debug expression failed:\n",
               (char (*) [26])"RemapResources ^ VerifyBindings",(char (*) [32])(ulong)local_1ad);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"InitPipelineLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x327);
    std::__cxx11::string::~string((string *)(BindIndexToDescSetIndex._M_elems + 6));
  }
  memset(local_188,0,0x20);
  for (local_18c = 0;
      local_18c < (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount;
      local_18c = local_18c + 1) {
    UVar4 = PipelineLayoutVk::GetFirstDescrSetIndex(&this->m_PipelineLayout,local_18c);
    pvVar6 = std::array<unsigned_int,_8UL>::operator[]
                       ((array<unsigned_int,_8UL> *)local_188,(ulong)local_18c);
    *pvVar6 = UVar4;
  }
  RemapOrVerifyShaderResources
            (ShaderStages,(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_Signatures
             ,(uint)(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount,
             (TBindIndexToDescSetIndex *)local_188,local_1ad,true,
             (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
             .m_Desc.super_DeviceObjectAttribs.Name,&this->m_ShaderResources,
             &this->m_ResourceAttibutions);
  return;
}

Assistant:

void PipelineStateVkImpl::InitPipelineLayout(const PipelineStateCreateInfo& CreateInfo, TShaderStages& ShaderStages) noexcept(false)
{
    const PSO_CREATE_INTERNAL_FLAGS InternalFlags = GetInternalCreateFlags(CreateInfo);
    if (m_UsingImplicitSignature && (InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) == 0)
    {
        const PipelineResourceSignatureDescWrapper SignDesc = GetDefaultResourceSignatureDesc(ShaderStages, m_Desc.Name, m_Desc.ResourceLayout, m_Desc.SRBAllocationGranularity);
        InitDefaultSignature(SignDesc, GetActiveShaderStages(), false /*bIsDeviceInternal*/);
        VERIFY_EXPR(m_Signatures[0]);
    }

#ifdef DILIGENT_DEVELOPMENT
    DvpValidateResourceLimits();
#endif

    m_PipelineLayout.Create(GetDevice(), m_Signatures, m_SignatureCount);

    const bool RemapResources = (CreateInfo.Flags & PSO_CREATE_FLAG_DONT_REMAP_SHADER_RESOURCES) == 0;
    const bool VerifyBindings = !RemapResources && ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_NO_SHADER_REFLECTION) == 0);
    if (RemapResources || VerifyBindings)
    {
        VERIFY_EXPR(RemapResources ^ VerifyBindings);
        TBindIndexToDescSetIndex BindIndexToDescSetIndex = {};
        for (Uint32 i = 0; i < m_SignatureCount; ++i)
            BindIndexToDescSetIndex[i] = m_PipelineLayout.GetFirstDescrSetIndex(i);

        // Note that we always need to strip reflection information when it is present
        RemapOrVerifyShaderResources(ShaderStages,
                                     m_Signatures,
                                     m_SignatureCount,
                                     BindIndexToDescSetIndex,
                                     VerifyBindings, // VerifyOnly
                                     true,           // bStripReflection
                                     m_Desc.Name,
#ifdef DILIGENT_DEVELOPMENT
                                     &m_ShaderResources, &m_ResourceAttibutions
#else
                                     nullptr, nullptr
#endif
        );
    }
}